

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void kahanBabuskaNeumaierStepInt64(SumCtx *pSum,i64 iVal)

{
  long in_RSI;
  SumCtx *in_RDI;
  i64 iSm;
  i64 iBig;
  
  if ((in_RSI < -0xfffffffffffff) || (0xfffffffffffff < in_RSI)) {
    kahanBabuskaNeumaierStep(in_RDI,(double)(in_RSI - in_RSI % 0x4000));
    kahanBabuskaNeumaierStep(in_RDI,(double)(in_RSI % 0x4000));
  }
  else {
    kahanBabuskaNeumaierStep(in_RDI,(double)in_RSI);
  }
  return;
}

Assistant:

static void kahanBabuskaNeumaierStepInt64(volatile SumCtx *pSum, i64 iVal){
  if( iVal<=-4503599627370496LL || iVal>=+4503599627370496LL ){
    i64 iBig, iSm;
    iSm = iVal % 16384;
    iBig = iVal - iSm;
    kahanBabuskaNeumaierStep(pSum, iBig);
    kahanBabuskaNeumaierStep(pSum, iSm);
  }else{
    kahanBabuskaNeumaierStep(pSum, (double)iVal);
  }
}